

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

void __thiscall
PerspectiveCamera::PerspectiveCamera
          (PerspectiveCamera *this,Vec3f pos,Vec3f center,Vec3f up,float fovy,float aspect)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar13 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Vec3f VVar21;
  Vec3f local_78;
  Vec3f local_68;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  Vec3f local_40;
  Vec3f local_30;
  undefined8 uVar12;
  
  auVar6._8_56_ = pos._8_56_;
  auVar6._0_8_ = pos._0_8_;
  local_30.z = up.z;
  auVar18._8_56_ = up._8_56_;
  auVar18._0_8_ = up._0_8_;
  auVar17._8_56_ = center._8_56_;
  auVar17._0_8_ = center._0_8_;
  local_30._0_8_ = vmovlps_avx(auVar18._0_16_);
  uVar12 = vmovlps_avx(auVar6._0_16_);
  (this->pos).x = (float)(int)uVar12;
  (this->pos).y = (float)(int)((ulong)uVar12 >> 0x20);
  (this->pos).z = pos.z;
  auVar5 = vsubps_avx(auVar17._0_16_,auVar6._0_16_);
  auVar13 = ZEXT856(auVar5._8_8_);
  local_68.z = center.z - pos.z;
  local_68._0_8_ = vmovlps_avx(auVar5);
  VVar21 = Vec3f::normalized(&local_68);
  auVar7._0_8_ = VVar21._0_8_;
  auVar7._8_56_ = auVar13;
  uVar12 = vmovlps_avx(auVar7._0_16_);
  (this->dir).x = (float)(int)uVar12;
  (this->dir).y = (float)(int)((ulong)uVar12 >> 0x20);
  (this->dir).z = VVar21.z;
  (this->up).z = local_30.z;
  (this->up).x = local_30.x;
  (this->up).y = local_30.y;
  (this->screen_dv).z = 0.0;
  (this->dir_top_left).x = 0.0;
  (this->dir_top_left).y = 0.0;
  *(undefined8 *)&(this->dir_top_left).z = 0;
  (this->screen_du).y = 0.0;
  (this->screen_du).z = 0.0;
  (this->screen_dv).x = 0.0;
  (this->screen_dv).y = 0.0;
  auVar13 = ZEXT856(0);
  VVar21 = Vec3f::normalized(&this->dir);
  local_68.z = VVar21.z;
  auVar8._0_8_ = VVar21._0_8_;
  auVar8._8_56_ = auVar13;
  local_68._0_8_ = vmovlps_avx(auVar8._0_16_);
  VVar21 = Vec3f::cross(&local_68,&local_30);
  uVar12 = auVar13._0_8_;
  local_78.z = VVar21.z;
  auVar9._0_8_ = VVar21._0_8_;
  auVar9._8_56_ = auVar13;
  local_78._0_8_ = vmovlps_avx(auVar9._0_16_);
  VVar21 = Vec3f::normalized(&local_78);
  auVar5._0_8_ = VVar21._0_8_ ^ 0x8000000080000000;
  auVar5._8_4_ = (uint)uVar12 ^ 0x80000000;
  auVar5._12_4_ = (uint)((ulong)uVar12 >> 0x20) ^ 0x80000000;
  auVar13 = ZEXT856(auVar5._8_8_);
  local_40.z = -VVar21.z;
  local_40._0_8_ = vmovlps_avx(auVar5);
  VVar21 = Vec3f::cross(&local_40,&local_68);
  local_78.z = VVar21.z;
  auVar10._0_8_ = VVar21._0_8_;
  auVar10._8_56_ = auVar13;
  local_78._0_8_ = vmovlps_avx(auVar10._0_16_);
  VVar21 = Vec3f::normalized(&local_78);
  auVar11._0_8_ = VVar21._0_8_;
  auVar11._8_56_ = auVar13;
  _local_58 = auVar11._0_16_;
  fVar4 = sinf(fovy * 0.5 * 0.017453292);
  fVar4 = fVar4 + fVar4;
  fVar1 = fVar4 * aspect;
  auVar20._8_8_ = 0;
  auVar20._0_4_ = local_68.x;
  auVar20._4_4_ = local_68.y;
  fVar2 = fVar1 * 0.5;
  auVar15._0_4_ = local_40.x * fVar2;
  auVar15._4_4_ = local_40.y * fVar2;
  auVar15._8_4_ = fVar2 * 0.0;
  auVar15._12_4_ = fVar2 * 0.0;
  fVar3 = fVar4 * 0.5;
  auVar5 = vsubps_avx(auVar20,auVar15);
  auVar19._0_4_ = (float)local_58._0_4_ * fVar3;
  auVar19._4_4_ = (float)local_58._4_4_ * fVar3;
  auVar19._8_4_ = fStack_50 * fVar3;
  auVar19._12_4_ = fStack_4c * fVar3;
  auVar5 = vsubps_avx(auVar5,auVar19);
  uVar12 = vmovlps_avx(auVar5);
  (this->dir_top_left).x = (float)(int)uVar12;
  (this->dir_top_left).y = (float)(int)((ulong)uVar12 >> 0x20);
  (this->dir_top_left).z = (local_68.z - local_40.z * fVar2) - VVar21.z * fVar3;
  auVar16._0_4_ = local_40.x * fVar1;
  auVar16._4_4_ = local_40.y * fVar1;
  auVar16._8_4_ = fVar1 * 0.0;
  auVar16._12_4_ = fVar1 * 0.0;
  uVar12 = vmovlps_avx(auVar16);
  (this->screen_du).x = (float)(int)uVar12;
  (this->screen_du).y = (float)(int)((ulong)uVar12 >> 0x20);
  (this->screen_du).z = fVar1 * local_40.z;
  auVar14._0_4_ = (float)local_58._0_4_ * fVar4;
  auVar14._4_4_ = (float)local_58._4_4_ * fVar4;
  auVar14._8_4_ = fStack_50 * fVar4;
  auVar14._12_4_ = fStack_4c * fVar4;
  uVar12 = vmovlps_avx(auVar14);
  (this->screen_dv).x = (float)(int)uVar12;
  (this->screen_dv).y = (float)(int)((ulong)uVar12 >> 0x20);
  (this->screen_dv).z = VVar21.z * fVar4;
  return;
}

Assistant:

PerspectiveCamera::PerspectiveCamera(Vec3f pos, Vec3f center, Vec3f up, float fovy, float aspect)
	: pos(pos), dir((center - pos).normalized()), up(up)
{
	Vec3f dz = dir.normalized();
	Vec3f dx = -dz.cross(up).normalized();
	Vec3f dy = dx.cross(dz).normalized();
	float dim_y = 2.f * std::sin((fovy / 2.f) * (static_cast<float>(M_PI) / 180.f));
	float dim_x = dim_y * aspect;
	dir_top_left = dz - 0.5f * dim_x * dx - 0.5f * dim_y * dy;
	screen_du = dx * dim_x;
	screen_dv = dy * dim_y;
}